

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ShowDebugLogFlag(char *name,ImGuiDebugLogFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 IVar8;
  float fVar9;
  float fVar10;
  
  pIVar6 = GImGui;
  fVar1 = GImGui->FontSize;
  fVar2 = (GImGui->Style).FramePadding.y;
  fVar3 = (GImGui->Style).ItemInnerSpacing.x;
  if (name == (char *)0x0) {
    fVar9 = 0.0;
  }
  else {
    IVar8 = ImFont::CalcTextSizeA
                      (GImGui->Font,fVar1,3.4028235e+38,-1.0,name,(char *)0x0,(char **)0x0);
    fVar9 = (float)(int)(IVar8.x + 0.99999);
  }
  pIVar5 = GImGui->CurrentWindow;
  fVar10 = (pIVar5->DC).CursorPosPrevLine.x + (GImGui->Style).ItemSpacing.x;
  if (((((pIVar5->WorkRect).Min.x <= fVar10) &&
       (fVar4 = (pIVar5->DC).CursorPosPrevLine.y, (pIVar5->WorkRect).Min.y <= fVar4)) &&
      (fVar2 + fVar2 + fVar1 + fVar3 + fVar9 + fVar10 <= (pIVar5->WorkRect).Max.x)) &&
     ((fVar1 = (GImGui->Style).FramePadding.y,
      fVar1 + fVar1 + GImGui->FontSize + fVar4 <= (pIVar5->WorkRect).Max.y &&
      (pIVar5->SkipItems == false)))) {
    (pIVar5->DC).CursorPos.x = fVar10;
    (pIVar5->DC).CursorPos.y = fVar4;
    (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
    (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
    (pIVar5->DC).IsSameLine = true;
  }
  bVar7 = ImGui::CheckboxFlags(name,&pIVar6->DebugLogFlags,flags);
  if (((bVar7) && ((pIVar6->IO).KeyShift == true)) && ((pIVar6->DebugLogFlags & flags) != 0)) {
    pIVar6->DebugLogAutoDisableFrames = '\x02';
    pIVar6->DebugLogAutoDisableFlags = pIVar6->DebugLogAutoDisableFlags | flags;
  }
  ImGui::SetItemTooltip
            ("Hold SHIFT when clicking to enable for 2 frames only (useful for spammy log entries)")
  ;
  return;
}

Assistant:

static void ShowDebugLogFlag(const char* name, ImGuiDebugLogFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size(ImGui::GetFrameHeight() + g.Style.ItemInnerSpacing.x + ImGui::CalcTextSize(name).x, ImGui::GetFrameHeight());
    SameLineOrWrap(size); // FIXME-LAYOUT: To be done automatically once we rework ItemSize/ItemAdd into ItemLayout.
    if (ImGui::CheckboxFlags(name, &g.DebugLogFlags, flags) && g.IO.KeyShift && (g.DebugLogFlags & flags) != 0)
    {
        g.DebugLogAutoDisableFrames = 2;
        g.DebugLogAutoDisableFlags |= flags;
    }
    ImGui::SetItemTooltip("Hold SHIFT when clicking to enable for 2 frames only (useful for spammy log entries)");
}